

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b3D_integrator.cpp
# Opt level: O1

void __thiscall NetworkNS::cb3D_integrator::~cb3D_integrator(cb3D_integrator *this)

{
  free(this->bd_x);
  free(this->bd_x_ps);
  free(this->bd_mass);
  free(this->bd_f);
  free(this->bd_nb_f);
  free(this->bd_gamma);
  return;
}

Assistant:

cb3D_integrator::~cb3D_integrator() {
      free(bd_x);
      free(bd_x_ps);
      free(bd_mass);
      free(bd_f);
      free(bd_nb_f);
      free(bd_gamma);

      return;
   }